

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFADepartureSet<char>::add
          (NFADepartureSet<char> *this,Range<char> *r,NFAClosure *closure)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  bool local_91;
  CharClass<char> local_78;
  _Base_ptr local_58;
  _Rb_tree_const_iterator<int> local_50;
  _Rb_tree_const_iterator<int> local_48;
  reference local_40;
  pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *p;
  iterator __end0;
  iterator __begin0;
  NFADepartureSet<char> *__range2;
  NFAClosure *closure_local;
  Range<char> *r_local;
  NFADepartureSet<char> *this_local;
  
  __end0 = std::
           vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::begin(&this->
                    super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  );
  p = (pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
      std::
      vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::end(&this->
             super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           );
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                *)&p);
    if (!bVar1) {
      CharClass<char>::CharClass(&local_78,r);
      std::
      vector<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>>>
      ::
      emplace_back<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>const&>
                ((vector<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<Centaurus::CharClass<char>,std::set<int,std::less<int>,std::allocator<int>>>>>
                  *)&this->
                     super_vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                 ,&local_78,closure);
      CharClass<char>::~CharClass(&local_78);
      return;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
               ::operator*(&__end0);
    sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(closure);
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&local_40->second);
    local_91 = false;
    if (sVar2 == sVar3) {
      local_48._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin(closure);
      local_50._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::cend(closure);
      local_58 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin(&local_40->second);
      local_91 = std::equal<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
                           (local_48,local_50,(_Rb_tree_const_iterator<int>)local_58);
    }
    if (local_91 != false) break;
    __gnu_cxx::
    __normal_iterator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_*,_std::vector<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<Centaurus::CharClass<char>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
    ::operator++(&__end0);
  }
  CharClass<char>::operator|=(&local_40->first,r);
  return;
}

Assistant:

void add(const Range<TCHAR>& r, const NFAClosure& closure)
    {
        for (auto& p : *this)
        {
            if (closure.size() == p.second.size() && std::equal(closure.cbegin(), closure.cend(), p.second.cbegin()))
            {
                p.first |= r;
                return;
            }
        }
        this->emplace_back(CharClass<TCHAR>(r), closure);
    }